

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O3

void __thiscall Matrix::Matrix(Matrix *this,int i,int j,int k,int l)

{
  int *piVar1;
  
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Matrix_0015c778;
  (this->matrixParent).px = (double *)0x0;
  (this->matrixParent).pn.pi_ = (sp_counted_base *)0x0;
  (this->sMatrixName)._M_dataplus._M_p = (pointer)&(this->sMatrixName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->sMatrixName,"data","");
  this->nMatrixDimension = 4;
  piVar1 = (int *)operator_new__(0x10);
  this->pSize = piVar1;
  *piVar1 = i;
  piVar1[1] = j;
  piVar1[2] = k;
  piVar1[3] = l;
  this->bReference = false;
  init(this,(EVP_PKEY_CTX *)0x1);
  return;
}

Assistant:

Matrix::Matrix(int i, int j, int k, int l) : sMatrixName("data") 
 { 
	nMatrixDimension = 4;
	pSize = new int[nMatrixDimension];
	pSize[0] = i;
	pSize[1] = j;
	pSize[2] = k;
	pSize[3] = l;
	bReference = false;
	init();
}